

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O2

vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> * __thiscall
Jupiter::GenericCommandNamespace::getCommands
          (vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
           *__return_storage_ptr__,GenericCommandNamespace *this)

{
  pointer ppGVar1;
  pointer ppGVar2;
  int iVar3;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> *__range3;
  GenericCommand **namespace_command;
  pointer __x;
  pointer __x_00;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> namespace_commands;
  _Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> local_48;
  
  std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::vector
            (__return_storage_ptr__,
             (long)(this->m_commands).
                   super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_commands).
                   super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_48);
  ppGVar1 = (this->m_commands).
            super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__x_00 = (this->m_commands).
                super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                ._M_impl.super__Vector_impl_data._M_start; __x_00 != ppGVar1; __x_00 = __x_00 + 1) {
    std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::push_back
              (__return_storage_ptr__,__x_00);
    iVar3 = (*((*__x_00)->super_Command)._vptr_Command[4])();
    if (((char)iVar3 != '\0') && (((GenericCommandNamespace *)*__x_00)->m_using == true)) {
      getCommands((vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> *)
                  &local_48,(GenericCommandNamespace *)*__x_00);
      ppGVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
      for (__x = local_48._M_impl.super__Vector_impl_data._M_start; __x != ppGVar2; __x = __x + 1) {
        std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::
        push_back(__return_storage_ptr__,__x);
      }
      std::_Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::
      ~_Vector_base(&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Jupiter::GenericCommand*> Jupiter::GenericCommandNamespace::getCommands() const {
	std::vector<Jupiter::GenericCommand*> result(m_commands.size());

	for (const auto& command : m_commands) {
		result.push_back(command);

		if (command->isNamespace() && static_cast<GenericCommandNamespace*>(command)->isUsing()) {
			// Add commands from namespace
			auto namespace_commands = static_cast<GenericCommandNamespace*>(command)->getCommands();
			for (const auto& namespace_command : namespace_commands)
				result.push_back(namespace_command);
		}
	}

	return result;
}